

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O2

ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *state,ZydisDecodedInstruction *instruction)

{
  byte *pbVar1;
  ZyanU8 *pZVar2;
  ZyanU8 ZVar3;
  ZyanU8 ZVar4;
  ZydisMachineMode ZVar5;
  ZydisInstructionEncoding ZVar6;
  ZydisDecoderContext *pZVar7;
  ZydisDecoder *pZVar8;
  bool bVar9;
  uint3 uVar10;
  ulong *puVar11;
  undefined8 *puVar12;
  int iVar13;
  ZyanU8 ZVar14;
  byte bVar15;
  ZyanBool ZVar16;
  short sVar17;
  ZyanU16 ZVar18;
  ushort uVar19;
  ZyanStatus status_047620348;
  ZydisOpcodeMap ZVar20;
  ZyanStatus ZVar21;
  ZydisInstructionCategory ZVar22;
  uint uVar23;
  ZydisDecoderTreeNode *pZVar24;
  ZydisDecoderTreeNode *node;
  ZydisDecoderTreeNode *pZVar25;
  ulong uVar26;
  sbyte sVar27;
  byte bVar28;
  byte bVar29;
  char cVar30;
  ZydisMaskMode ZVar31;
  ZydisBranchType ZVar32;
  ZydisMaskMode ZVar33;
  ZyanU8 *pZVar34;
  undefined1 *puVar35;
  undefined2 *puVar36;
  ZyanU8 *pZVar37;
  byte bVar38;
  byte bVar39;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  undefined3 *puVar43;
  byte bVar44;
  ulong uVar45;
  long lVar46;
  byte bVar47;
  byte bVar48;
  byte bVar49;
  char cVar50;
  byte bVar51;
  char cVar52;
  byte bVar53;
  ZydisBroadcastMode ZVar54;
  bool bVar55;
  ZyanU16 index;
  ZydisDecoderState *local_c8;
  bool local_b9;
  ZydisDecoderContext *local_b8;
  ZyanU8 prefix_bytes [4];
  undefined4 uStack_ac;
  ZyanU8 modrm_byte_2;
  undefined7 uStack_57;
  undefined4 local_4c;
  ulong local_48;
  ZydisInstructionDefinitionLEGACY *def;
  ZydisInstructionEncodingInfo *info;
  
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x1243,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  pZVar37 = &instruction->opcode;
  pZVar2 = &(instruction->raw).evex.mmm;
  pZVar25 = (ZydisDecoderTreeNode *)0x0;
  node = &zydis_decoder_tree_root;
  local_c8 = state;
LAB_00107e4e:
  do {
    pZVar24 = pZVar25;
    index = 0;
    ZVar54 = ZYDIS_BROADCAST_MODE_4_TO_8;
    switch(node->type) {
    case '\0':
      if (pZVar24 == (ZydisDecoderTreeNode *)0x0) {
        return 0x80200001;
      }
      ZVar14 = (local_c8->prefixes).mandatory_candidate;
      if (ZVar14 != '\0') {
        bVar44 = (local_c8->prefixes).offset_mandatory;
        (instruction->raw).prefixes[bVar44].type = ZYDIS_PREFIX_TYPE_IGNORED;
        if (ZVar14 == 'f') {
          if ((local_c8->prefixes).offset_osz_override == bVar44) {
            (instruction->raw).prefixes[bVar44].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
          instruction->attributes = instruction->attributes | 0x80000000000;
        }
      }
      pZVar25 = (ZydisDecoderTreeNode *)0x0;
      node = pZVar24;
      goto LAB_00107e4e;
    case '\x01':
      if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
LAB_0010819c:
        ZVar18 = 0;
      }
      else {
        if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_XOP) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xddf,
                        "ZyanStatus ZydisNodeHandlerXOP(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xddb,
                        "ZyanStatus ZydisNodeHandlerXOP(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        bVar44 = (instruction->raw).xop.pp;
        ZVar18 = ((ushort)(instruction->raw).xop.m_mmmm + (ushort)bVar44 + (ushort)bVar44 * 2) - 7;
      }
      break;
    case '\x02':
      if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) goto LAB_0010819c;
      if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xdf3,
                      "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
      }
      if ((instruction->attributes & 0x10) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 4)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xdef,
                      "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
      }
      ZVar18 = (ushort)(instruction->raw).vex.m_mmmm + (ushort)(instruction->raw).vex.pp * 4 + 1;
      break;
    case '\x03':
      ZVar6 = instruction->encoding;
      if (ZVar6 == ZYDIS_INSTRUCTION_ENCODING_LEGACY) goto LAB_0010819c;
      if (ZVar6 == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xe07,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        sVar17 = 0x21;
        sVar27 = 2;
        lVar46 = 0x11a;
        pZVar34 = &(instruction->raw).mvex.mmmm;
      }
      else {
        if (ZVar6 != ZYDIS_INSTRUCTION_ENCODING_EVEX) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xe0b,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xe03,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        sVar17 = 1;
        sVar27 = 3;
        lVar46 = 0x10b;
        pZVar34 = pZVar2;
      }
      ZVar18 = sVar17 + (ushort)*pZVar34 +
               ((ushort)*(byte *)((long)((instruction->raw).prefixes + -0xf) + 4 + lVar46) << sVar27
               );
      break;
    case '\x04':
      if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_3DNOW) {
        index = 0xc;
        ZVar18 = index;
      }
      else {
        if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
          ZVar21 = ZydisInputNext(local_c8,instruction,pZVar37);
          if ((int)ZVar21 < 0) {
            return ZVar21;
          }
          goto LAB_001083e6;
        }
        ZVar21 = ZydisInputNext(local_c8,instruction,pZVar37);
        if ((int)ZVar21 < 0) {
          return ZVar21;
        }
        ZVar20 = instruction->opcode_map;
        if (ZYDIS_OPCODE_MAP_MAX_VALUE < ZVar20) {
LAB_0010ab1d:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xed0,
                        "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((0xe0cU >> (ZVar20 & 0x1f) & 1) == 0) {
          if (ZVar20 == ZYDIS_OPCODE_MAP_DEFAULT) {
            bVar44 = *pZVar37;
            if (bVar44 - 0xc4 < 2) {
LAB_0010855a:
              bVar28 = instruction->length;
              if (0xe < bVar28) {
                return 0x80200002;
              }
              if (local_c8->buffer_len == 0) {
                return 0x80200000;
              }
              if ((0xbf < *local_c8->buffer) ||
                 (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)) {
                uVar26 = instruction->attributes;
                if ((uVar26 & 4) != 0) {
                  return 0x80200006;
                }
                if ((local_c8->prefixes).has_lock != '\0') {
                  return 0x80200004;
                }
                if ((local_c8->prefixes).mandatory_candidate != '\0') {
                  return 0x80200005;
                }
                prefix_bytes[1] = '\0';
                prefix_bytes[2] = '\0';
                prefix_bytes[3] = '\0';
                prefix_bytes[0] = bVar44;
                if (bVar44 == 0x62) {
                  if ((uVar26 & 0x20) != 0) {
                    __assert_fail("!(instruction->attributes & (1ULL << 5))",
                                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                  ,0xe4c,
                                  "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                 );
                  }
                  if ((uVar26 & 0x40) != 0) {
                    __assert_fail("!(instruction->attributes & (1ULL << 6))",
                                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                  ,0xe4d,
                                  "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                 );
                  }
                  ZVar14 = '\x03';
LAB_001087c5:
                  ZVar21 = ZydisInputNextBytes(local_c8,instruction,prefix_bytes + 1,ZVar14);
                }
                else {
                  if (bVar44 != 0xc5) {
                    if (bVar44 != 0xc4) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                    ,0xe54,
                                    "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                   );
                    }
                    (instruction->raw).vex.offset = bVar28 - 1;
                    if ((uVar26 & 0x10) != 0) {
                      __assert_fail("!(instruction->attributes & (1ULL << 4))",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                    ,0xe40,
                                    "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                   );
                    }
                    ZVar14 = '\x02';
                    goto LAB_001087c5;
                  }
                  (instruction->raw).vex.offset = bVar28 - 1;
                  if ((uVar26 & 0x10) != 0) {
                    __assert_fail("!(instruction->attributes & (1ULL << 4))",
                                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                  ,0xe46,
                                  "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                 );
                  }
                  ZVar21 = ZydisInputNext(local_c8,instruction,prefix_bytes + 1);
                }
                if ((int)ZVar21 < 0) {
                  return ZVar21;
                }
                if (*pZVar37 - 0xc4 < 2) {
                  instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS;
                  if ((prefix_bytes[0] & 0xfe) != 0xc4) {
                    __assert_fail("(data[0] == 0xC4) || (data[0] == 0xC5)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                  ,0x1ca,
                                  "ZyanStatus ZydisDecodeVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                                 );
                  }
                  if (instruction->machine_mode == ZYDIS_MACHINE_MODE_MAX_VALUE) {
                    return 0x80200001;
                  }
                  pZVar7 = local_c8->context;
                  *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x10;
                  uVar23 = (uint)(instruction->raw).vex.offset;
                  if (prefix_bytes[0] == 0xc4) {
                    if (instruction->length - 3 != uVar23) {
                      __assert_fail("instruction->raw.vex.offset == instruction->length - 3",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                    ,0x1d6,
                                    "ZyanStatus ZydisDecodeVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                                   );
                    }
                    (instruction->raw).vex.size = '\x03';
                    (instruction->raw).vex.R = prefix_bytes[1] >> 7;
                    bVar28 = prefix_bytes[1] >> 6 & 1;
                    (instruction->raw).vex.X = bVar28;
                    bVar47 = prefix_bytes[1] >> 5 & 1;
                    (instruction->raw).vex.B = bVar47;
                    bVar15 = prefix_bytes[1] & 0x1f;
                    ZVar20 = (ZydisOpcodeMap)bVar15;
                    (instruction->raw).vex.m_mmmm = bVar15;
                    bVar51 = prefix_bytes[2] >> 7;
                    (instruction->raw).vex.W = bVar51;
                    bVar44 = prefix_bytes[2] >> 3 & 0xf;
                    (instruction->raw).vex.vvvv = bVar44;
                    bVar49 = prefix_bytes[2] >> 2 & 1;
                    (instruction->raw).vex.L = bVar49;
                    (instruction->raw).vex.pp = prefix_bytes[2] & 3;
                    if (3 < bVar15) {
                      return 0x80200007;
                    }
                    bVar28 = bVar28 ^ 1;
                    bVar47 = bVar47 ^ 1;
                  }
                  else {
                    if (instruction->length - 2 != uVar23) {
                      __assert_fail("instruction->raw.vex.offset == instruction->length - 2",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                    ,0x1e2,
                                    "ZyanStatus ZydisDecodeVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                                   );
                    }
                    (instruction->raw).vex.size = '\x02';
                    (instruction->raw).vex.R = prefix_bytes[1] >> 7;
                    (instruction->raw).vex.X = '\x01';
                    (instruction->raw).vex.B = '\x01';
                    (instruction->raw).vex.m_mmmm = '\x01';
                    (instruction->raw).vex.W = '\0';
                    bVar44 = prefix_bytes[1] >> 3 & 0xf;
                    (instruction->raw).vex.vvvv = bVar44;
                    bVar49 = prefix_bytes[1] >> 2 & 1;
                    (instruction->raw).vex.L = bVar49;
                    (instruction->raw).vex.pp = prefix_bytes[1] & 3;
                    ZVar20 = ZYDIS_OPCODE_MAP_0F;
                    bVar51 = 0;
                    bVar28 = 0;
                    bVar47 = 0;
                  }
                  (pZVar7->vector_unified).W = bVar51;
                  (pZVar7->vector_unified).R = prefix_bytes[1] >> 7 ^ 1;
                  (pZVar7->vector_unified).X = bVar28;
                  (pZVar7->vector_unified).B = bVar47;
                  (pZVar7->vector_unified).L = bVar49;
                  (pZVar7->vector_unified).LL = bVar49;
                  (pZVar7->vector_unified).vvvv = bVar44 ^ 0xf;
                }
                else {
                  if (*pZVar37 != 0x62) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                  ,0xe8c,
                                  "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                 );
                  }
                  bVar44 = instruction->length;
                  bVar28 = bVar44 - 4;
                  if ((prefix_bytes[2] & 4) == 0) {
                    (instruction->raw).mvex.offset = bVar28;
                    if (local_c8->decoder->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) {
                      return 0x80200001;
                    }
                    instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE;
                    if (prefix_bytes[0] != 'b') {
                      __assert_fail("data[0] == 0x62",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                    ,0x275,
                                    "ZyanStatus ZydisDecodeMVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                                   );
                    }
                    if (bVar44 - 4 != (uint)bVar28) {
                      __assert_fail("instruction->raw.mvex.offset == instruction->length - 4",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                    ,0x276,
                                    "ZyanStatus ZydisDecodeMVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                                   );
                    }
                    if (instruction->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) {
                      return 0x80200001;
                    }
                    pZVar7 = local_c8->context;
                    *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x40;
                    (instruction->raw).mvex.R = prefix_bytes[1] >> 7;
                    bVar28 = prefix_bytes[1] >> 6 & 1;
                    (instruction->raw).mvex.X = bVar28;
                    bVar47 = prefix_bytes[1] >> 5 & 1;
                    (instruction->raw).mvex.B = bVar47;
                    bVar49 = prefix_bytes[1] >> 4 & 1;
                    (instruction->raw).mvex.R2 = bVar49;
                    bVar44 = prefix_bytes[1] & 0xf;
                    ZVar20 = (ZydisOpcodeMap)bVar44;
                    (instruction->raw).mvex.mmmm = bVar44;
                    if (3 < bVar44) {
                      return 0x80200007;
                    }
                    (instruction->raw).mvex.W = prefix_bytes[2] >> 7;
                    bVar44 = prefix_bytes[2] >> 3 & 0xf;
                    (instruction->raw).mvex.vvvv = bVar44;
                    (instruction->raw).mvex.pp = prefix_bytes[2] & 3;
                    (instruction->raw).mvex.E = prefix_bytes[3] >> 7;
                    (instruction->raw).mvex.SSS = prefix_bytes[3] >> 4 & 7;
                    bVar51 = prefix_bytes[3] >> 3 & 1;
                    (instruction->raw).mvex.V2 = bVar51;
                    (instruction->raw).mvex.kkk = prefix_bytes[3] & 7;
                    (pZVar7->vector_unified).W = prefix_bytes[2] >> 7;
                    (pZVar7->vector_unified).R = prefix_bytes[1] >> 7 ^ 1;
                    (pZVar7->vector_unified).X = bVar28 ^ 1;
                    (pZVar7->vector_unified).B = bVar47 ^ 1;
                    (pZVar7->vector_unified).R2 = bVar49 ^ 1;
                    (pZVar7->vector_unified).V2 = bVar51 ^ 1;
                    (pZVar7->vector_unified).LL = '\x02';
                    (pZVar7->vector_unified).vvvv = bVar44 ^ 0xf;
                    (pZVar7->vector_unified).mask = prefix_bytes[3] & 7;
                  }
                  else {
                    (instruction->raw).evex.offset = bVar28;
                    instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_EVEX;
                    if (prefix_bytes[0] != 'b') {
                      __assert_fail("data[0] == 0x62",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                    ,0x216,
                                    "ZyanStatus ZydisDecodeEVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                                   );
                    }
                    if (bVar44 - 4 != (uint)bVar28) {
                      __assert_fail("instruction->raw.evex.offset == instruction->length - 4",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                    ,0x217,
                                    "ZyanStatus ZydisDecodeEVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                                   );
                    }
                    ZVar5 = instruction->machine_mode;
                    if (ZVar5 == ZYDIS_MACHINE_MODE_MAX_VALUE) {
                      return 0x80200001;
                    }
                    pZVar7 = local_c8->context;
                    *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x20;
                    (instruction->raw).evex.R = prefix_bytes[1] >> 7;
                    bVar44 = prefix_bytes[1] >> 6 & 1;
                    (instruction->raw).evex.X = bVar44;
                    bVar47 = prefix_bytes[1] >> 5 & 1;
                    (instruction->raw).evex.B = bVar47;
                    bVar28 = prefix_bytes[1] >> 4 & 1;
                    (instruction->raw).evex.R2 = bVar28;
                    if ((prefix_bytes[1] & 8) != 0) {
                      return 0x80200008;
                    }
                    ZVar20 = prefix_bytes[1] & ZYDIS_OPCODE_MAP_MAP7;
                    *pZVar2 = (ZyanU8)ZVar20;
                    if ((ZVar20 < ZYDIS_OPCODE_MAP_0F0F) && ((0x91U >> ZVar20 & 1) != 0)) {
                      return 0x80200007;
                    }
                    (instruction->raw).evex.W = prefix_bytes[2] >> 7;
                    (instruction->raw).evex.vvvv = prefix_bytes[2] >> 3 & 0xf;
                    (instruction->raw).evex.pp = prefix_bytes[2] & 3;
                    (instruction->raw).evex.z = prefix_bytes[3] >> 7;
                    (instruction->raw).evex.L2 = prefix_bytes[3] >> 6 & 1;
                    (instruction->raw).evex.L = prefix_bytes[3] >> 5 & 1;
                    (instruction->raw).evex.b = prefix_bytes[3] >> 4 & 1;
                    bVar49 = prefix_bytes[3] >> 3 & 1;
                    (instruction->raw).evex.V2 = bVar49;
                    if ((ZVar5 != ZYDIS_MACHINE_MODE_LONG_64) && (bVar49 == 0)) {
                      return 0x80200008;
                    }
                    (instruction->raw).evex.aaa = prefix_bytes[3] & 7;
                    (pZVar7->vector_unified).W = prefix_bytes[2] >> 7;
                    (pZVar7->vector_unified).R = prefix_bytes[1] >> 7 ^ 1;
                    (pZVar7->vector_unified).X = bVar44 ^ 1;
                    (pZVar7->vector_unified).B = bVar47 ^ 1;
                    bVar44 = prefix_bytes[3] >> 5 & 3;
                    (pZVar7->vector_unified).LL = bVar44;
                    (pZVar7->vector_unified).R2 = bVar28 ^ 1;
                    (pZVar7->vector_unified).V2 = bVar49 ^ 1;
                    (pZVar7->vector_unified).vvvv = prefix_bytes[2] >> 3 & 0xf ^ 0xf;
                    (pZVar7->vector_unified).mask = prefix_bytes[3] & 7;
                    if ((prefix_bytes[3] >> 4 & 1) == 0 && bVar44 == 3) {
                      return 0x80200008;
                    }
                  }
                }
                instruction->opcode_map = ZVar20;
              }
            }
            else if (bVar44 == 0x8f) {
              if (0xe < instruction->length) {
                return 0x80200002;
              }
              if (local_c8->buffer_len == 0) {
                return 0x80200000;
              }
              if ((*local_c8->buffer & 0x18) != 0) {
                if ((instruction->attributes & 4) != 0) {
                  return 0x80200006;
                }
                if ((local_c8->prefixes).has_lock != '\0') {
                  return 0x80200004;
                }
                if ((local_c8->prefixes).mandatory_candidate != '\0') {
                  return 0x80200005;
                }
                (instruction->raw).xop.offset = instruction->length - 1;
                prefix_bytes[2] = '\0';
                prefix_bytes[0] = 0x8f;
                prefix_bytes[1] = '\0';
                ZVar21 = ZydisInputNextBytes(local_c8,instruction,prefix_bytes + 1,'\x02');
                if ((int)ZVar21 < 0) {
                  return ZVar21;
                }
                instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_XOP;
                if (prefix_bytes[0] != 0x8f) {
                  __assert_fail("data[0] == 0x8F",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                ,0x196,
                                "ZyanStatus ZydisDecodeXOP(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                               );
                }
                if ((prefix_bytes[1] & 0x18) == 0) {
                  __assert_fail("((data[1] >> 0) & 0x1F) >= 8",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                ,0x197,
                                "ZyanStatus ZydisDecodeXOP(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                               );
                }
                if (instruction->length - 3 != (uint)(instruction->raw).xop.offset) {
                  __assert_fail("instruction->raw.xop.offset == instruction->length - 3",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                ,0x198,
                                "ZyanStatus ZydisDecodeXOP(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                               );
                }
                if (instruction->machine_mode == ZYDIS_MACHINE_MODE_MAX_VALUE) {
                  return 0x80200001;
                }
                pZVar7 = local_c8->context;
                *(byte *)&instruction->attributes = (byte)instruction->attributes | 8;
                (instruction->raw).xop.R = prefix_bytes[1] >> 7;
                bVar44 = prefix_bytes[1] >> 6 & 1;
                (instruction->raw).xop.X = bVar44;
                bVar28 = prefix_bytes[1] >> 5 & 1;
                (instruction->raw).xop.B = bVar28;
                ZVar14 = (ZyanU8)(prefix_bytes[1] & 0x1f);
                (instruction->raw).xop.m_mmmm = ZVar14;
                if ((byte)(ZVar14 - 0xb) < 0xfd) {
                  return 0x80200007;
                }
                (instruction->raw).xop.W = prefix_bytes[2] >> 7;
                bVar47 = prefix_bytes[2] >> 3 & 0xf;
                (instruction->raw).xop.vvvv = bVar47;
                bVar49 = prefix_bytes[2] >> 2 & 1;
                (instruction->raw).xop.L = bVar49;
                (instruction->raw).xop.pp = prefix_bytes[2] & 3;
                (pZVar7->vector_unified).W = prefix_bytes[2] >> 7;
                (pZVar7->vector_unified).R = prefix_bytes[1] >> 7 ^ 1;
                (pZVar7->vector_unified).X = bVar44 ^ 1;
                (pZVar7->vector_unified).B = bVar28 ^ 1;
                (pZVar7->vector_unified).L = bVar49;
                (pZVar7->vector_unified).LL = bVar49;
                (pZVar7->vector_unified).vvvv = bVar47 ^ 0xf;
                instruction->opcode_map = (prefix_bytes[1] & 0x1f) + ZYDIS_OPCODE_MAP_0F;
              }
            }
            else {
              if (bVar44 == 0x62) goto LAB_0010855a;
              if (bVar44 == 0xf) {
                instruction->opcode_map = ZYDIS_OPCODE_MAP_0F;
              }
            }
          }
          else {
            if (ZVar20 != ZYDIS_OPCODE_MAP_0F) goto LAB_0010ab1d;
            ZVar14 = *pZVar37;
            if (ZVar14 == ':') {
              instruction->opcode_map = ZYDIS_OPCODE_MAP_0F3A;
            }
            else if (ZVar14 == '8') {
              instruction->opcode_map = ZYDIS_OPCODE_MAP_0F38;
            }
            else if (ZVar14 == '\x0f') {
              if ((local_c8->prefixes).has_lock != '\0') {
                return 0x80200004;
              }
              instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_3DNOW;
              instruction->opcode_map = ZYDIS_OPCODE_MAP_0F0F;
            }
          }
        }
LAB_001083e6:
        ZVar18 = (ushort)*pZVar37;
      }
      break;
    case '\x05':
      if (5 < (ulong)instruction->machine_mode) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xef5,
                      "ZyanStatus ZydisNodeHandlerMode(const ZydisDecodedInstruction *, ZyanU16 *)")
        ;
      }
      ZVar18 = *(ZyanU16 *)(&DAT_0010f904 + (ulong)instruction->machine_mode * 2);
      break;
    case '\x06':
      bVar55 = instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64;
      goto LAB_00108313;
    case '\a':
      ZVar21 = ZydisNodeHandlerModrmMod(local_c8,instruction,&index);
      ZVar18 = index;
      if ((int)ZVar21 < 0) {
        return ZVar21;
      }
      break;
    case '\b':
      ZVar21 = ZydisNodeHandlerModrmMod(local_c8,instruction,&index);
      if ((int)ZVar21 < 0) {
        return ZVar21;
      }
      bVar55 = index == 3;
      goto LAB_00108313;
    case '\t':
      if ((instruction->raw).modrm.offset == '\0') {
        (instruction->raw).modrm.offset = instruction->length;
        ZVar21 = ZydisInputNext(local_c8,instruction,prefix_bytes);
        if ((int)ZVar21 < 0) {
          return ZVar21;
        }
        ZydisDecodeModRM(instruction,prefix_bytes[0]);
      }
      ZVar18 = (ushort)(instruction->raw).modrm.reg;
      break;
    case '\n':
      if ((instruction->raw).modrm.offset == '\0') {
        (instruction->raw).modrm.offset = instruction->length;
        ZVar21 = ZydisInputNext(local_c8,instruction,prefix_bytes);
        if ((int)ZVar21 < 0) {
          return ZVar21;
        }
        ZydisDecodeModRM(instruction,prefix_bytes[0]);
      }
      ZVar18 = (ushort)(instruction->raw).modrm.rm;
      break;
    case '\v':
      bVar55 = (local_c8->prefixes).group1 == '\0';
LAB_00108313:
      ZVar18 = (ushort)!bVar55;
      break;
    case '\f':
      ZVar14 = (local_c8->prefixes).mandatory_candidate;
      if (ZVar14 == 0xf3) {
        (instruction->raw).prefixes[(local_c8->prefixes).offset_mandatory].type =
             ZYDIS_PREFIX_TYPE_MANDATORY;
        index = 3;
      }
      else if (ZVar14 == 0xf2) {
        (instruction->raw).prefixes[(local_c8->prefixes).offset_mandatory].type =
             ZYDIS_PREFIX_TYPE_MANDATORY;
        index = 4;
      }
      else {
        index = 1;
        if (ZVar14 == 'f') {
          (instruction->raw).prefixes[(local_c8->prefixes).offset_mandatory].type =
               ZYDIS_PREFIX_TYPE_MANDATORY;
          pbVar1 = (byte *)((long)&instruction->attributes + 5);
          *pbVar1 = *pbVar1 & 0xf7;
          index = 2;
        }
      }
      pZVar24 = ZydisDecoderTreeGetChildNode(node,0);
      ZVar18 = index;
      break;
    case '\r':
      ZVar5 = instruction->machine_mode;
      if ((ZVar5 != ZYDIS_MACHINE_MODE_LONG_64) ||
         (ZVar18 = 2, (local_c8->context->vector_unified).W == '\0')) {
        uVar26 = instruction->attributes;
        if ((uVar26 & 0x80000000000) != 0) {
          (instruction->raw).prefixes[(local_c8->prefixes).offset_osz_override].type =
               ZYDIS_PREFIX_TYPE_EFFECTIVE;
        }
        if (ZYDIS_MACHINE_MODE_MAX_VALUE < ZVar5) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xf83,
                        "ZyanStatus ZydisNodeHandlerOperandSize(const ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((0xbU >> (ZVar5 & 0x1f) & 1) == 0) {
          uVar19 = (ushort)(uint)(uVar26 >> 0x2b);
          goto LAB_0010839c;
        }
        ZVar18 = (ushort)((uVar26 & 0x80000000000) == 0);
      }
      break;
    case '\x0e':
      ZVar5 = instruction->machine_mode;
      if (ZYDIS_MACHINE_MODE_MAX_VALUE < ZVar5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfa3,
                      "ZyanStatus ZydisNodeHandlerAddressSize(ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((0x34U >> (ZVar5 & 0x1f) & 1) == 0) {
        if ((10U >> (ZVar5 & 0x1f) & 1) == 0) {
          ZVar18 = ((instruction->attributes & 0x100000000000) == 0) + 1;
        }
        else {
          ZVar18 = (ushort)((instruction->attributes & 0x100000000000) == 0);
        }
      }
      else {
        uVar19 = (ushort)(uint)(instruction->attributes >> 0x2c);
LAB_0010839c:
        ZVar18 = uVar19 & 1;
      }
      break;
    case '\x0f':
      if (local_c8->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfac,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(instruction->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfb3,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((instruction->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfb6,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfb9,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfbc,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfbf,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      ZVar18 = (ZyanU16)(local_c8->context->vector_unified).LL;
      if (ZVar18 == 3) {
        return 0x80200001;
      }
      break;
    case '\x10':
      if (local_c8->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfcd,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(instruction->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfe3,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfd7,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((instruction->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfda,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfdd,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfe0,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
      }
      ZVar18 = (ushort)(local_c8->context->vector_unified).W;
      break;
    case '\x11':
      if (local_c8->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfec,
                      "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(instruction->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x1002,
                      "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xff6,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((instruction->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xff9,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xffc,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfff,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
      }
      ZVar18 = (ushort)(local_c8->context->vector_unified).B;
      break;
    case '\x12':
      if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_EVEX) {
        __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x100e,
                      "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((instruction->attributes & 0x20) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 5)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x100f,
                      "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      ZVar18 = (ushort)(instruction->raw).evex.b;
      break;
    case '\x13':
      if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
        __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x101b,
                      "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((instruction->attributes & 0x40) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 6)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x101c,
                      "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      ZVar18 = (ushort)(instruction->raw).mvex.E;
      break;
    case '\x14':
      bVar55 = local_c8->decoder->decoder_mode[1] == '\0';
      goto LAB_00108369;
    case '\x15':
      bVar55 = local_c8->decoder->decoder_mode[2] == '\0';
      goto LAB_00108369;
    case '\x16':
      bVar55 = local_c8->decoder->decoder_mode[3] == '\0';
      goto LAB_00108369;
    case '\x17':
      bVar55 = local_c8->decoder->decoder_mode[4] == '\0';
      goto LAB_00108369;
    case '\x18':
      bVar55 = local_c8->decoder->decoder_mode[5] == '\0';
      goto LAB_00108369;
    case '\x19':
      bVar55 = local_c8->decoder->decoder_mode[6] == '\0';
      goto LAB_00108369;
    case '\x1a':
      bVar55 = local_c8->decoder->decoder_mode[7] == '\0';
      goto LAB_00108369;
    case '\x1b':
      bVar55 = local_c8->decoder->decoder_mode[8] == '\0';
LAB_00108369:
      ZVar18 = (ushort)!bVar55;
      break;
    default:
      goto switchD_00107e73_default;
    }
    index = ZVar18;
    node = ZydisDecoderTreeGetChildNode(node,index);
    pZVar25 = pZVar24;
  } while( true );
switchD_00109c82_caseD_4:
  if (0xbf < bVar51) {
    __assert_fail("def->element_size < (sizeof(scales) / sizeof((scales)[0]))",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x9ec,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar14 = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_113 + (ulong)(bVar51 >> 5));
  goto LAB_0010a9ed;
switchD_00107e73_default:
  if (-1 < (char)node->type) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x1311,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  ZydisGetInstructionDefinition
            (instruction->encoding,node->value,(ZydisInstructionDefinition **)prefix_bytes);
  pZVar7 = local_c8->context;
  if (pZVar7 == (ZydisDecoderContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0xd15,
                  "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  puVar11 = (ulong *)CONCAT44(uStack_ac,
                              CONCAT13(prefix_bytes[3],
                                       CONCAT12(prefix_bytes[2],
                                                CONCAT11(prefix_bytes[1],prefix_bytes[0]))));
  if (puVar11 == (ulong *)0x0) {
    __assert_fail("definition",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0xd17,
                  "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  uVar26 = instruction->attributes;
  bVar44 = (byte)(uVar26 >> 0x2b) & 1;
  ZVar5 = instruction->machine_mode;
  if (ZVar5 == ZYDIS_MACHINE_MODE_LONG_64) {
    bVar44 = bVar44 | (pZVar7->vector_unified).W * '\x02' & 2 | 4;
  }
  else if ((ZVar5 == ZYDIS_MACHINE_MODE_LEGACY_32) || (ZVar5 == ZYDIS_MACHINE_MODE_LONG_COMPAT_32))
  {
    bVar44 = bVar44 | 2;
  }
  bVar44 = ZydisSetEffectiveOperandWidth_operand_size_map
           [(ulong)bVar44 + (ulong)((uint)(*puVar11 >> 0x21) & 7) * 8];
  instruction->operand_width = bVar44;
  pZVar7->eosz_index = bVar44 >> 5;
  if ((*puVar11 & 0xe00000000) == 0x200000000) {
    instruction->operand_width = '\b';
  }
  bVar44 = (byte)(uVar26 >> 0x2c) & 1;
  if (ZVar5 == ZYDIS_MACHINE_MODE_LONG_64) {
    bVar44 = bVar44 | 4;
  }
  else if ((ZVar5 == ZYDIS_MACHINE_MODE_LEGACY_32) || (ZVar5 == ZYDIS_MACHINE_MODE_LONG_COMPAT_32))
  {
    bVar44 = bVar44 | 2;
  }
  uVar26 = (ulong)((uint)(*puVar11 >> 0x24) & 3);
  if (uVar26 == 3) {
    __assert_fail("definition->address_size_map < (sizeof(address_size_map) / sizeof((address_size_map)[0]))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0xdc7,
                  "void ZydisSetEffectiveAddressWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  bVar44 = ZydisSetEffectiveAddressWidth_address_size_map[(ulong)bVar44 + uVar26 * 8];
  instruction->address_width = bVar44;
  pZVar7->easz_index = bVar44 >> 5;
  ZydisGetInstructionEncodingInfo(node,&info);
  if (info == (ZydisInstructionEncodingInfo *)0x0) {
    __assert_fail("info",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0xc90,
                  "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                 );
  }
  pZVar7 = local_c8->context;
  bVar44 = info->flags;
  if ((bVar44 & 1) != 0) {
    if ((instruction->raw).modrm.offset == '\0') {
      (instruction->raw).modrm.offset = instruction->length;
      ZVar21 = ZydisInputNext(local_c8,instruction,&modrm_byte_2);
      if ((int)ZVar21 < 0) {
        return ZVar21;
      }
      ZydisDecodeModRM(instruction,modrm_byte_2);
      bVar44 = info->flags;
    }
    if ((bVar44 & 0x10) == 0) {
      ZVar14 = instruction->address_width;
      if ((ZVar14 != '@') && (ZVar14 != ' ')) {
        if (ZVar14 != '\x10') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xcd6,
                        "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                       );
        }
        switch((instruction->raw).modrm.mod) {
        case '\0':
          ZVar14 = '\x10';
          if ((instruction->raw).modrm.rm == '\x06') break;
          goto LAB_00108fee;
        case '\x01':
          ZVar14 = '\b';
          break;
        case '\x02':
          ZVar14 = '\x10';
          break;
        case '\x03':
          bVar28 = 1;
          goto LAB_00108ff6;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xcb6,
                        "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                       );
        }
LAB_00108fc6:
        ZVar21 = ZydisReadDisplacement(local_c8,instruction,ZVar14);
        if ((int)ZVar21 < 0) {
          return ZVar21;
        }
        goto LAB_00108fdf;
      }
      ZVar3 = (instruction->raw).modrm.mod;
      bVar28 = 1;
      if (ZVar3 != '\x03') {
        ZVar4 = (instruction->raw).modrm.rm;
        if (ZVar3 == '\x02') {
          ZVar14 = ' ';
        }
        else {
          ZVar14 = '\b';
          if (ZVar3 != '\x01') {
            if (ZVar3 != '\0') {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0xcd2,
                            "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                           );
            }
            if (ZVar4 == '\x05') {
              ZVar14 = ' ';
              if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
                *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x80;
              }
              goto LAB_00108fc6;
            }
            ZVar14 = '\0';
          }
        }
        if (ZVar4 == '\x04') {
          (instruction->raw).sib.offset = instruction->length;
          ZVar21 = ZydisInputNext(local_c8,instruction,&modrm_byte_2);
          if ((int)ZVar21 < 0) {
            return ZVar21;
          }
          uVar26 = instruction->attributes;
          if ((uVar26 & 1) == 0) {
            __assert_fail("instruction->attributes & (1ULL << 0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x2c0,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
          }
          if ((instruction->raw).modrm.rm != '\x04') {
            __assert_fail("instruction->raw.modrm.rm == 4",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x2c1,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
          }
          if ((uVar26 & 2) != 0) {
            __assert_fail("!(instruction->attributes & (1ULL << 1))",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x2c2,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
          }
          if (instruction->length - 1 != (uint)(instruction->raw).sib.offset) {
            __assert_fail("instruction->raw.sib.offset == instruction->length - 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x2c3,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
          }
          instruction->attributes = uVar26 | 2;
          (instruction->raw).sib.scale = modrm_byte_2 >> 6;
          (instruction->raw).sib.index = modrm_byte_2 >> 3 & 7;
          (instruction->raw).sib.base = modrm_byte_2 & 7;
          if (((modrm_byte_2 & 7) == 5) && (ZVar14 = ' ', (instruction->raw).modrm.mod == '\x01')) {
            ZVar14 = '\b';
          }
        }
        if (ZVar14 != '\0') goto LAB_00108fc6;
        goto LAB_00108fdf;
      }
    }
    else {
LAB_00108fdf:
      bVar44 = info->flags;
      bVar28 = 1;
      if ((instruction->raw).modrm.mod != '\x03') {
LAB_00108fee:
        bVar28 = bVar44 >> 4 & 1;
      }
    }
LAB_00108ff6:
    (pZVar7->reg_info).is_mod_reg = bVar28;
  }
  if ((bVar44 & 2) != 0) {
    ZVar21 = ZydisReadDisplacement(local_c8,instruction,(info->disp).size[pZVar7->easz_index]);
    if ((int)ZVar21 < 0) {
      return ZVar21;
    }
    bVar44 = info->flags;
  }
  if ((bVar44 & 4) != 0) {
    ZVar16 = info->imm[0].is_relative;
    if (ZVar16 != '\0') {
      *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x80;
    }
    ZVar21 = ZydisReadImmediate(local_c8,instruction,'\0',info->imm[0].size[pZVar7->eosz_index],
                                info->imm[0].is_signed,ZVar16);
    if ((int)ZVar21 < 0) {
      return ZVar21;
    }
    bVar44 = info->flags;
  }
  if ((bVar44 & 8) != 0) {
    if ((bVar44 & 2) != 0) {
      __assert_fail("!(info->flags & 0x02)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xd00,
                    "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                   );
    }
    ZVar21 = ZydisReadImmediate(local_c8,instruction,'\x01',info->imm[1].size[pZVar7->eosz_index],
                                info->imm[1].is_signed,info->imm[1].is_relative);
    if ((int)ZVar21 < 0) {
      return ZVar21;
    }
  }
  def = (ZydisInstructionDefinitionLEGACY *)
        CONCAT44(uStack_ac,
                 CONCAT13(prefix_bytes[3],
                          CONCAT12(prefix_bytes[2],CONCAT11(prefix_bytes[1],prefix_bytes[0]))));
  if (def == (ZydisInstructionDefinitionLEGACY *)0x0) {
    __assert_fail("definition",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x10fe,
                  "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar6 = instruction->encoding;
  if (ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE < ZVar6) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x1199,
                  "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  uVar23 = *(uint *)&def->field_0x8;
  switch(ZVar6) {
  case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
    local_b9 = true;
    if (((*(ulong *)def >> 0x2d & 1) != 0) &&
       (instruction->machine_mode == ZYDIS_MACHINE_MODE_MAX_VALUE)) {
      return 0x80200001;
    }
    if (((*(ulong *)def >> 0x2e & 1) != 0) &&
       (instruction->machine_mode - ZYDIS_MACHINE_MODE_LONG_COMPAT_32 < 2)) {
      return 0x80200001;
    }
    uVar19 = 0;
    bVar28 = 0;
    bVar44 = 0;
    uVar26 = 0;
    if ((local_c8->prefixes).has_lock != '\0' && -1 < (int)uVar23) {
      return 0x80200004;
    }
    break;
  case ZYDIS_INSTRUCTION_ENCODING_3DNOW:
    local_b9 = true;
    uVar19 = 0;
    bVar28 = 0;
    bVar44 = 0;
    uVar26 = 0;
    break;
  case ZYDIS_INSTRUCTION_ENCODING_XOP:
    local_b9 = true;
    uVar26 = (ulong)(*(uint5 *)&def->field_0x8 >> 0x1e & 0xff) & 0xffffffffffffff1f;
    uVar19 = 0;
    bVar28 = 0;
    bVar44 = 0;
    break;
  case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
    uVar26 = (ulong)(*(uint6 *)&def->field_0x8 >> 0x1e);
    bVar44 = (byte)*(undefined2 *)&def->field_0xc;
    local_b9 = (*(uint6 *)&def->field_0x8 & 0x2000000000) == 0;
    uVar19 = 0;
    goto LAB_001092dd;
  case ZYDIS_INSTRUCTION_ENCODING_EVEX:
    local_b9 = true;
    uVar26 = (ulong)(*(uint5 *)&def->field_0x8 >> 0x1e & 0xff) & 0xffffffffffffff1f;
    bVar44 = (byte)def->field_0xc >> 3 & 1;
    bVar28 = (byte)def->field_0xc >> 4 & 1;
    uVar19 = *(ushort *)(def + 1) >> 2 & 3;
    if (((instruction->raw).evex.z != '\0') && ((*(ushort *)(def + 1) & 0x10) == 0)) {
      return 0x8020000a;
    }
    break;
  case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
    uVar19 = *(ushort *)&def->field_0xc;
    uVar26 = (ulong)(uVar19 >> 6 & 0x1f);
    if (0x19 < uVar26) {
      __assert_fail("def->functionality < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x118d,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar45 = (ulong)(instruction->raw).mvex.SSS;
    if (7 < uVar45) {
      __assert_fail("instruction->raw.mvex.SSS < 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x118e,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (ZydisCheckErrorConditions_lookup[uVar45 + uVar26 * 8] == '\0') {
      return 0x80200001;
    }
    local_b9 = true;
    uVar26 = (ulong)(byte)(CONCAT24(uVar19,*(undefined4 *)&def->field_0x8) >> 0x1e);
    bVar44 = (byte)uVar19;
    uVar19 = uVar19 >> 0xb & 3;
LAB_001092dd:
    bVar44 = bVar44 >> 3 & 1;
    uVar26 = uVar26 & 0xffffffffffffff1f;
    bVar28 = 0;
  }
  bVar47 = (byte)(uVar23 >> 0xd);
  uVar40 = uVar23 >> 0x12;
  local_b8 = local_c8->context;
  ZVar16 = (local_b8->reg_info).is_mod_reg;
  uVar41 = 0;
  uVar45 = (ulong)(bVar47 & 0xf);
  if ((uVar23 >> 0xd & 0x1f) == 0) {
    uVar45 = 0;
  }
  if ((uVar40 & 0x1f) == 0) {
LAB_00109369:
    uVar42 = 0;
LAB_0010936c:
    bVar49 = (instruction->raw).modrm.rm;
  }
  else {
    if (ZVar16 != '\0') {
      uVar41 = uVar40 & 0xffffff0f;
      uVar42 = CONCAT71((int7)((ulong)info >> 8),0xf < ((byte)uVar40 & 0x1f));
      goto LAB_0010936c;
    }
    uVar41 = uVar40 & 0xffffff07;
    if ((((uVar40 & 8) == 0) || (local_c8->decoder->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)) ||
       ((instruction->raw).modrm.mod != '\0')) goto LAB_00109369;
    bVar49 = (instruction->raw).modrm.rm;
    if (bVar49 == 5) {
      return 0x80200003;
    }
    uVar42 = 0;
  }
  bVar55 = bVar49 == 4;
  bVar9 = ZVar16 == '\0';
  cVar52 = (char)uVar41;
  bVar51 = (instruction->raw).modrm.reg;
  bVar15 = (local_b8->vector_unified).vvvv;
  local_48 = (ulong)(uVar41 & 0xff);
  if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
    local_4c = (undefined4)uVar42;
    bVar29 = (local_b8->vector_unified).V2 << 4;
    bVar38 = bVar29;
    if (cVar52 != '\x04' || (!bVar55 || !bVar9)) {
      bVar38 = 0;
    }
    ZVar14 = (local_b8->vector_unified).X;
    bVar39 = ZVar14 << 4;
    if (ZVar6 < ZYDIS_INSTRUCTION_ENCODING_EVEX) {
      bVar39 = 0;
    }
    bVar48 = (local_b8->vector_unified).B << 3;
    if (ZVar16 == '\0') {
      bVar53 = 0xff;
    }
    else {
      bVar53 = ZydisPopulateRegisterIds_mask_rm[local_48];
    }
    bVar53 = bVar53 & (bVar49 | bVar48 | bVar39);
    bVar29 = bVar29 | bVar15;
    bVar48 = bVar48 | *(byte *)((long)(instruction->raw).imm + (ulong)(bVar55 && bVar9) * 4 + -0x16)
    ;
    bVar38 = bVar38 | (instruction->raw).sib.index | ZVar14 << 3;
    bVar51 = ((local_b8->vector_unified).R << 3 | (local_b8->vector_unified).R2 << 4 | bVar51) &
             ZydisPopulateRegisterIds_mask_reg[uVar45];
    uVar42 = uVar42 & 0xffffffff;
  }
  else {
    bVar29 = bVar15 & 7;
    bVar48 = *(byte *)((long)(instruction->raw).imm + (ulong)(bVar55 && bVar9) * 4 + -0x16);
    bVar38 = (instruction->raw).sib.index;
    bVar53 = bVar49;
  }
  cVar50 = (char)uVar26;
  if (cVar50 == '\0') {
    if (bVar15 != 0) {
      return 0x80200003;
    }
    if ((cVar52 != '\x04' || (!bVar55 || !bVar9)) && ((local_b8->vector_unified).V2 != '\0')) {
      return 0x80200003;
    }
  }
  bVar55 = instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64;
  if ((byte)ZydisPopulateRegisterIds_available_regs[uVar45 + (ulong)bVar55 * 0xc] <= bVar51) {
    return 0x80200003;
  }
  if ((byte)ZydisPopulateRegisterIds_available_regs[(uVar26 & 0xff) + (ulong)bVar55 * 0xc] <= bVar29
     ) {
    return 0x80200003;
  }
  if ((ZVar16 != '\0') &&
     ((byte)ZydisPopulateRegisterIds_available_regs[local_48 + (ulong)bVar55 * 0xc] <= bVar53)) {
    return 0x80200003;
  }
  cVar30 = (char)uVar45;
  bVar15 = 0xff;
  if (cVar30 == '\b') {
    bVar15 = bVar51;
  }
  bVar39 = bVar53;
  if (cVar52 != '\b') {
    bVar39 = bVar15;
  }
  if (ZVar16 == '\0') {
    bVar39 = bVar15;
  }
  if (-1 < (char)bVar39) {
    if (0xf < bVar39) {
      __assert_fail("id_cr < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x10dc,
                    "ZyanStatus ZydisPopulateRegisterIds(ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanU8)"
                   );
    }
    if ((0xfee2UL >> ((ulong)bVar39 & 0x3f) & 1) != 0) {
      return 0x80200003;
    }
  }
  bVar15 = -(cVar30 == '\0') | bVar51;
  (local_b8->reg_info).id_reg = bVar15;
  bVar53 = -(ZVar16 == '\0') | -(cVar52 == '\0') | bVar53;
  (local_b8->reg_info).id_rm = bVar53;
  bVar39 = -(cVar50 == '\0') | bVar29;
  (local_b8->reg_info).id_ndsndd = bVar39;
  (local_b8->reg_info).id_base = bVar48;
  (local_b8->reg_info).id_index = bVar38;
  if (0xf < (bVar47 & 0x1f) && bVar15 == 1) {
    return 0x80200003;
  }
  if (((byte)uVar42 & bVar53 == 1) != 0) {
    return 0x80200003;
  }
  if (bVar44 != 0) {
    if ((instruction->raw).modrm.mod == '\x03') {
      __assert_fail("instruction->raw.modrm.mod != 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x11d2,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar49 != 4) {
      __assert_fail("instruction->raw.modrm.rm == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x11d3,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    bVar44 = bVar15;
    if (ZVar6 == ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
      if (((cVar30 != '\x04') || (cVar52 != '\x04')) || (cVar50 != '\x04')) {
        __assert_fail("(def_reg == ZYDIS_REGKIND_VR) && (def_rm == ZYDIS_MEMOP_TYPE_VSIB) && (def_ndsndd == ZYDIS_REGKIND_VR)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x11dd,
                      "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    else {
      bVar29 = 0xf0;
      if ((ZVar6 & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) == ZYDIS_INSTRUCTION_ENCODING_EVEX) {
        if (((cVar50 != '\0') || ((uVar45 & 0xb) != 0)) || (cVar52 != '\x04')) {
          __assert_fail("((def_reg == ZYDIS_REGKIND_INVALID) || (def_reg == ZYDIS_REGKIND_VR)) && (def_rm == ZYDIS_MEMOP_TYPE_VSIB) && (def_ndsndd == ZYDIS_REGKIND_INVALID)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0x11e7,
                        "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        bVar44 = bVar51;
        bVar29 = 0xf0;
        if (cVar30 == '\0') {
          bVar44 = 0xf1;
        }
      }
    }
    if (bVar44 == bVar38) {
      return 0x80200003;
    }
    if (bVar29 == bVar44) {
      return 0x80200003;
    }
    if (bVar29 == bVar38) {
      return 0x80200003;
    }
  }
  if (bVar28 != 0) {
    if (1 < ZVar6 - ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
      __assert_fail("(instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) || (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x11fd,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar15 == bVar39) {
      return 0x80200003;
    }
    if (ZVar16 != '\0' && bVar15 == bVar53) {
      return 0x80200003;
    }
  }
  if (local_b9 == false) {
    if (ZVar6 != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
      __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x120d,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (ZVar16 == '\0') {
      __assert_fail("is_reg",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x120e,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar15 == bVar39) {
      return 0x80200003;
    }
    if (bVar39 == bVar53) {
      return 0x80200003;
    }
    if (bVar15 == bVar53) {
      return 0x80200003;
    }
  }
  if (1 < uVar19) {
    if (uVar19 == 3) {
      if ((local_b8->vector_unified).mask != '\0') {
        return 0x8020000a;
      }
    }
    else if ((local_b8->vector_unified).mask == '\0') {
      return 0x8020000a;
    }
  }
  if (ZVar6 == ZYDIS_INSTRUCTION_ENCODING_3DNOW) {
    ZVar21 = ZydisInputNext(local_c8,instruction,pZVar37);
    if ((int)ZVar21 < 0) {
      return ZVar21;
    }
    pZVar25 = ZydisDecoderTreeGetChildNode(&zydis_decoder_tree_root,0xf);
    pZVar25 = ZydisDecoderTreeGetChildNode(pZVar25,0xf);
    pZVar25 = ZydisDecoderTreeGetChildNode(pZVar25,(ushort)*pZVar37);
    if (pZVar25->type == '\0') {
      return 0x80200001;
    }
    if (pZVar25->type != '\b') {
      __assert_fail("node->type == ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x12db,
                    "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                   );
    }
    pZVar25 = ZydisDecoderTreeGetChildNode(pZVar25,(ushort)((instruction->raw).modrm.mod != '\x03'))
    ;
    if (-1 < (char)pZVar25->type) {
      __assert_fail("node->type & ZYDIS_NODETYPE_DEFINITION_MASK",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x12de,
                    "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                   );
    }
    ZydisGetInstructionDefinition
              (instruction->encoding,pZVar25->value,(ZydisInstructionDefinition **)prefix_bytes);
    def = (ZydisInstructionDefinitionLEGACY *)
          CONCAT44(uStack_ac,
                   CONCAT13(prefix_bytes[3],
                            CONCAT12(prefix_bytes[2],CONCAT11(prefix_bytes[1],prefix_bytes[0]))));
    local_b8 = local_c8->context;
  }
  instruction->mnemonic = *(ZydisMnemonic *)def & (ZYDIS_MNEMONIC_VPSHLDVD|ZYDIS_MNEMONIC_PAVGB);
  instruction->operand_count = (byte)(*(uint *)def >> 0xb) & 0xf;
  instruction->operand_count_visible = (byte)(*(uint *)def >> 0xf) & 7;
  local_b8->definition = def;
  puVar12 = (undefined8 *)
            CONCAT44(uStack_ac,
                     CONCAT13(prefix_bytes[3],
                              CONCAT12(prefix_bytes[2],CONCAT11(prefix_bytes[1],prefix_bytes[0]))));
  ZVar22 = (ZydisInstructionCategory)((ulong)*puVar12 >> 0x2f) &
           (ZYDIS_CATEGORY_UNCOND_BR|ZYDIS_CATEGORY_DATAXFER);
  (instruction->meta).category = ZVar22;
  (instruction->meta).isa_set =
       (ZydisISASet)((ulong)*puVar12 >> 0x36) & (ZYDIS_ISA_SET_PAUSE|ZYDIS_ISA_SET_PADLOCK_RNG);
  (instruction->meta).isa_ext =
       (uint)((ulong)*puVar12 >> 0x3e) + *(int *)(puVar12 + 1) * 4 &
       (ZYDIS_ISA_EXT_SMAP|ZYDIS_ISA_EXT_SHA);
  ZVar32 = *(uint *)(puVar12 + 1) >> 5 & ZYDIS_BRANCH_TYPE_FAR;
  (instruction->meta).branch_type = ZVar32;
  if (((ZVar32 != ZYDIS_BRANCH_TYPE_NONE) &&
      ((0x37 < ZVar22 - ZYDIS_CATEGORY_CALL ||
       ((0x80000000000101U >> ((ulong)(ZVar22 - ZYDIS_CATEGORY_CALL) & 0x3f) & 1) == 0)))) &&
     (ZVar22 != ZYDIS_CATEGORY_UNCOND_BR)) {
    __assert_fail("(instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_NONE) || ((instruction->meta.category == ZYDIS_CATEGORY_CALL) || (instruction->meta.category == ZYDIS_CATEGORY_COND_BR) || (instruction->meta.category == ZYDIS_CATEGORY_UNCOND_BR) || (instruction->meta.category == ZYDIS_CATEGORY_RET))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x12f2,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  (instruction->meta).exception_class =
       *(uint *)(puVar12 + 1) >> 7 & (ZYDIS_EXCEPTION_CLASS_E10|ZYDIS_EXCEPTION_CLASS_E9NF);
  pZVar8 = local_c8->decoder;
  if (pZVar8->decoder_mode[0] != '\0') {
    return 0x100000;
  }
  uVar23 = *(uint *)(puVar12 + 1);
  if ((uVar23 >> 0x17 & 3) != 0) {
    instruction->attributes =
         instruction->attributes |
         *(ulong *)(ZydisSetAttributes_mapping + (ulong)((byte)(uVar23 >> 0x17) & 3) * 8);
    uVar23 = *(uint *)(puVar12 + 1);
  }
  bVar44 = (byte)(uVar23 >> 0x19) & 3;
  if (bVar44 != 0) {
    instruction->attributes =
         instruction->attributes | *(ulong *)(ZydisSetAttributes_mapping_91 + (ulong)bVar44 * 8);
    uVar23 = *(uint *)(puVar12 + 1);
  }
  if ((uVar23 >> 0x1b & 3) != 0) {
    instruction->attributes =
         instruction->attributes |
         *(ulong *)(ZydisSetAttributes_mapping_93 + (ulong)((byte)(uVar23 >> 0x1b) & 3) * 8);
  }
  ZVar6 = instruction->encoding;
  if (ZVar6 - ZYDIS_INSTRUCTION_ENCODING_3DNOW < 5) {
    if ((*(byte *)((long)puVar12 + 0xb) & 0x20) != 0) {
      uVar26 = instruction->attributes;
      uVar45 = uVar26 | 0x4000000;
      instruction->attributes = uVar45;
      ZVar14 = (local_c8->prefixes).effective_segment;
      if (ZVar14 != '\0') {
        if (ZVar14 == '&') {
          uVar45 = 0x10004000000;
        }
        else if (ZVar14 == '.') {
          uVar45 = 0x2004000000;
        }
        else if (ZVar14 == 'e') {
          uVar45 = 0x40004000000;
        }
        else if (ZVar14 == '>') {
          uVar45 = 0x8004000000;
        }
        else if (ZVar14 == 'd') {
          uVar45 = 0x20004000000;
        }
        else {
          if (ZVar14 != '6') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x8c8,
                          "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          uVar45 = 0x4004000000;
        }
        uVar45 = uVar45 | uVar26;
        instruction->attributes = uVar45;
      }
      if ((uVar45 & 0x7e000000000) != 0) goto LAB_00109b70;
    }
  }
  else {
    if (ZVar6 != ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x8d3,
                    "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar23 = *(uint *)(puVar12 + 1);
    if ((uVar23 >> 0x1e & 1) != 0) {
      pbVar1 = (byte *)((long)&instruction->attributes + 1);
      *pbVar1 = *pbVar1 | 1;
      uVar23 = *(uint *)(puVar12 + 1);
    }
    if ((int)uVar23 < 0) {
      uVar26 = instruction->attributes;
      instruction->attributes = uVar26 | 0x10000;
      if ((local_c8->prefixes).has_lock != '\0') {
        instruction->attributes = uVar26 | 0x8010000;
        (instruction->raw).prefixes[(local_c8->prefixes).offset_lock].type =
             ZYDIS_PREFIX_TYPE_EFFECTIVE;
      }
    }
    uVar19 = *(ushort *)((long)puVar12 + 0xc);
    if ((uVar19 & 1) != 0) {
      pbVar1 = (byte *)((long)&instruction->attributes + 2);
      *pbVar1 = *pbVar1 | 2;
      uVar19 = *(ushort *)((long)puVar12 + 0xc);
    }
    if ((uVar19 & 2) != 0) {
      pbVar1 = (byte *)((long)&instruction->attributes + 2);
      *pbVar1 = *pbVar1 | 4;
      uVar19 = *(ushort *)((long)puVar12 + 0xc);
    }
    if ((uVar19 & 4) != 0) {
      pbVar1 = (byte *)((long)&instruction->attributes + 2);
      *pbVar1 = *pbVar1 | 8;
      uVar19 = *(ushort *)((long)puVar12 + 0xc);
    }
    if ((uVar19 & 8) != 0) {
      pbVar1 = (byte *)((long)&instruction->attributes + 2);
      *pbVar1 = *pbVar1 | 0x10;
      uVar19 = *(ushort *)((long)puVar12 + 0xc);
    }
    if ((uVar19 & 0x10) != 0) {
      pbVar1 = (byte *)((long)&instruction->attributes + 2);
      *pbVar1 = *pbVar1 | 0x20;
      uVar19 = *(ushort *)((long)puVar12 + 0xc);
    }
    cVar52 = (char)uVar19;
    if ((uVar19 & 0x20) != 0) {
      pbVar1 = (byte *)((long)&instruction->attributes + 2);
      *pbVar1 = *pbVar1 | 0x40;
      cVar52 = (char)*(undefined2 *)((long)puVar12 + 0xc);
    }
    if (cVar52 < '\0') {
      pbVar1 = (byte *)((long)&instruction->attributes + 2);
      *pbVar1 = *pbVar1 | 0x80;
    }
    ZVar14 = (local_c8->prefixes).group1;
    if (ZVar14 == 0xf3) {
      uVar26 = instruction->attributes;
      uVar23 = (uint)uVar26;
      if ((uVar23 >> 0x11 & 1) == 0) {
        if ((uVar23 >> 0x12 & 1) == 0) {
          if (((uVar23 >> 0x16 & 1) == 0) ||
             (((uVar23 >> 0x1b & 1) == 0 && ((*(byte *)((long)puVar12 + 0xc) & 0x80) == 0))))
          goto LAB_0010a029;
          uVar26 = uVar26 | 0x200000000;
        }
        else {
          uVar26 = uVar26 | 0x20000000;
        }
      }
      else {
        uVar26 = uVar26 | 0x10000000;
      }
LAB_0010a025:
      instruction->attributes = uVar26;
    }
    else if (ZVar14 == 0xf2) {
      uVar26 = instruction->attributes;
      uVar23 = (uint)uVar26;
      if ((uVar23 >> 0x13 & 1) == 0) {
        if (((uVar23 >> 0x15 & 1) == 0) ||
           (((uVar23 >> 0x1b & 1) == 0 && ((*(byte *)((long)puVar12 + 0xc) & 0x80) == 0)))) {
          if (((uVar23 >> 0x14 & 1) == 0) || (pZVar8->decoder_mode[3] == '\0')) goto LAB_0010a029;
          uVar26 = uVar26 | 0x80000000;
        }
        else {
          uVar26 = uVar26 | 0x100000000;
        }
      }
      else {
        uVar26 = uVar26 | 0x40000000;
      }
      goto LAB_0010a025;
    }
LAB_0010a029:
    bVar44 = (local_c8->prefixes).offset_group1;
    if (((instruction->raw).prefixes[bVar44].type == ZYDIS_PREFIX_TYPE_IGNORED) &&
       ((instruction->attributes & 0x3f0000000) != 0)) {
      (instruction->raw).prefixes[bVar44].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
    }
    if ((*(byte *)((long)puVar12 + 0xd) & 1) != 0) {
      uVar26 = instruction->attributes;
      instruction->attributes = uVar26 | 0x1000000;
      ZVar14 = (local_c8->prefixes).group2;
      if (ZVar14 == '.') {
        uVar45 = 0x401000000;
      }
      else {
        if (ZVar14 != '>') goto LAB_0010a0b1;
        uVar45 = 0x801000000;
      }
      instruction->attributes = uVar45 | uVar26;
      (instruction->raw).prefixes[(local_c8->prefixes).offset_group2].type =
           ZYDIS_PREFIX_TYPE_EFFECTIVE;
    }
LAB_0010a0b1:
    if ((*(byte *)((long)puVar12 + 0xc) & 0x40) != 0) {
      uVar26 = instruction->attributes;
      instruction->attributes = uVar26 | 0x2000000;
      if ((pZVar8->decoder_mode[4] != '\0') &&
         (lVar46 = (long)(local_c8->prefixes).offset_notrack, -1 < lVar46)) {
        instruction->attributes = uVar26 | 0x1002000000;
        (instruction->raw).prefixes[lVar46].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
      }
    }
    if (((*(byte *)((long)puVar12 + 0xb) & 0x20) == 0) ||
       ((*(byte *)((long)puVar12 + 0xd) & 1) != 0)) goto switchD_00109b9b_default;
    uVar26 = instruction->attributes;
    uVar45 = uVar26 | 0x4000000;
    instruction->attributes = uVar45;
    ZVar14 = (local_c8->prefixes).effective_segment;
    if ((uVar26 >> 0x24 & 1) == 0 && ZVar14 != '\0') {
      if (ZVar14 == '&') {
        uVar45 = 0x10004000000;
      }
      else if (ZVar14 == '.') {
        uVar45 = 0x2004000000;
      }
      else if (ZVar14 == 'e') {
        uVar45 = 0x40004000000;
      }
      else if (ZVar14 == '>') {
        uVar45 = 0x8004000000;
      }
      else if (ZVar14 == 'd') {
        uVar45 = 0x20004000000;
      }
      else {
        if (ZVar14 != '6') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0x89d,
                        "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        uVar45 = 0x4004000000;
      }
      uVar45 = uVar45 | uVar26;
      instruction->attributes = uVar45;
    }
    if ((uVar45 & 0x7e000000000) == 0) goto switchD_00109b9b_default;
LAB_00109b70:
    (instruction->raw).prefixes[(local_c8->prefixes).offset_segment].type =
         ZYDIS_PREFIX_TYPE_EFFECTIVE;
  }
  switch(ZVar6) {
  case ZYDIS_INSTRUCTION_ENCODING_XOP:
    uVar26 = (ulong)(local_b8->vector_unified).LL;
    if (1 < uVar26) {
      __assert_fail("context->vector_unified.LL < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x908,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).vector_length =
         *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_96 + uVar26 * 2);
    goto switchD_00109b9b_default;
  case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
    uVar26 = (ulong)(local_b8->vector_unified).LL;
    if (1 < uVar26) {
      __assert_fail("context->vector_unified.LL < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x914,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).vector_length =
         *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_96 + uVar26 * 2);
    if ((*(ushort *)((long)puVar12 + 0xc) & 0x1c0) != 0) {
      (instruction->avx).broadcast.is_static = '\x01';
      (instruction->avx).broadcast.mode =
           *(ZydisBroadcastMode *)
            (ZydisSetAVXInformation_broadcasts +
            (ulong)(*(ushort *)((long)puVar12 + 0xc) >> 6 & 7) * 4);
    }
    goto switchD_00109b9b_default;
  case ZYDIS_INSTRUCTION_ENCODING_EVEX:
    bVar44 = (local_b8->vector_unified).LL;
    bVar28 = *(byte *)((long)puVar12 + 0xc) >> 6;
    bVar47 = bVar28 - 1;
    if (bVar28 == 0) {
      bVar47 = bVar44;
    }
    if (2 < bVar47) {
      __assert_fail("vector_length < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x93d,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar26 = (ulong)bVar47;
    ZVar18 = *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_97 + uVar26 * 2);
    (instruction->avx).vector_length = ZVar18;
    (local_b8->evex).tuple_type = *(byte *)((long)puVar12 + 0xd) & 0x1f;
    bVar28 = *(byte *)((long)puVar12 + 0xd);
    ZVar14 = (instruction->raw).modrm.mod;
    if ((bVar28 & 0x1f) == 0) {
      if (ZVar14 != '\x03') {
        __assert_fail("instruction->raw.modrm.mod == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xa79,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      goto LAB_0010aa3e;
    }
    if (ZVar14 == '\x03') {
      __assert_fail("instruction->raw.modrm.mod != 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x943,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar28 < 0x20) {
      __assert_fail("def->element_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x944,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (0xbf < bVar28) {
      __assert_fail("def->element_size < (sizeof(element_sizes) / sizeof((element_sizes)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x94b,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    break;
  case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
    (instruction->avx).vector_length = 0x200;
    uVar10 = *(uint3 *)((long)puVar12 + 0xc);
    if ((uVar10 & 0x1c000) != 0 && (uVar10 & 0x2000) != 0) {
      __assert_fail("!index || !def->broadcast",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xacd,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar23 = uVar10 >> 0xd & 1;
    uVar26 = (ulong)uVar23;
    bVar55 = true;
    if ((char)uVar23 == '\0' && (uVar10 & 0x1c000) != 0) {
      (instruction->avx).broadcast.is_static = '\x01';
      uVar23 = *(uint3 *)((long)puVar12 + 0xc) >> 0xe & 7;
      uVar26 = (ulong)uVar23;
      bVar55 = true;
      switch(uVar23) {
      case 1:
        ZVar54 = ZYDIS_BROADCAST_MODE_1_TO_8;
        break;
      case 2:
        ZVar54 = ZYDIS_BROADCAST_MODE_1_TO_16;
        uVar26 = 1;
        break;
      case 3:
        bVar55 = false;
        uVar26 = 2;
        break;
      case 4:
        bVar55 = false;
        uVar26 = 2;
        ZVar54 = ZYDIS_BROADCAST_MODE_4_TO_16;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xae4,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      (instruction->avx).broadcast.mode = ZVar54;
      uVar10 = *(uint3 *)((long)puVar12 + 0xc);
    }
    bVar44 = (byte)(uVar10 >> 6);
    switch(uVar10 >> 6 & 0x1f) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 8:
    case 9:
      goto switchD_0010a1da_caseD_0;
    case 4:
    case 5:
    case 6:
    case 7:
      ZVar14 = '@';
      goto LAB_0010a3a2;
    case 10:
    case 0xb:
    case 0xc:
    case 0x12:
      uVar45 = (ulong)(instruction->raw).mvex.SSS;
      if (7 < uVar45) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb04,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar35 = ZydisSetAVXInformation_lookup_130;
      break;
    case 0xd:
    case 0x11:
    case 0x13:
    case 0x15:
      uVar45 = (ulong)(instruction->raw).mvex.SSS;
      if (2 < uVar45) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb22,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      uVar26 = uVar26 * 3;
      puVar36 = (undefined2 *)(ZydisSetAVXInformation_lookup_133 + uVar45);
      goto LAB_0010a39d;
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x14:
      uVar45 = (ulong)(instruction->raw).mvex.SSS;
      if (7 < uVar45) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb13,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar35 = ZydisSetAVXInformation_lookup_132;
      break;
    case 0x16:
    case 0x18:
      if (!bVar55) {
        __assert_fail("index < 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb2e,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      uVar45 = (ulong)(instruction->raw).mvex.SSS;
      if (7 < uVar45) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb2f,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar35 = ZydisSetAVXInformation_lookup_134;
      break;
    case 0x17:
    case 0x19:
      if (!bVar55) {
        __assert_fail("index < 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb3b,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if ((instruction->raw).mvex.SSS != '\0') {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb3c,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar36 = &ZydisSetAVXInformation_lookup_136;
LAB_0010a39d:
      pZVar37 = (ZyanU8 *)((long)puVar36 + uVar26);
      goto LAB_0010a3a0;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xb41,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    pZVar37 = puVar35 + uVar45 + uVar26 * 8;
LAB_0010a3a0:
    ZVar14 = *pZVar37;
LAB_0010a3a2:
    local_b8->cd8_scale = ZVar14;
    bVar44 = (byte)(*(ushort *)((long)puVar12 + 0xc) >> 6);
switchD_0010a1da_caseD_0:
    (local_b8->mvex).functionality = bVar44 & 0x1f;
    switch(*(ushort *)((long)puVar12 + 0xc) >> 6 & 0x1f) {
    case 0:
    case 1:
    case 4:
    case 5:
    case 6:
    case 7:
    case 0x13:
    case 0x15:
    case 0x17:
    case 0x19:
      break;
    case 2:
      bVar44 = (instruction->raw).mvex.SSS;
      (instruction->avx).rounding.mode = (bVar44 & 3) + ZYDIS_ROUNDING_MODE_RN;
      goto LAB_0010a952;
    case 3:
      bVar44 = (instruction->raw).mvex.SSS;
LAB_0010a952:
      if (3 < bVar44) {
        (instruction->avx).has_sae = '\x01';
      }
      break;
    case 8:
    case 9:
      (instruction->avx).swizzle.mode = (instruction->raw).mvex.SSS + ZYDIS_SWIZZLE_MODE_DCBA;
      break;
    case 10:
    case 0xb:
    case 0xc:
      switch((instruction->raw).mvex.SSS) {
      case '\0':
        break;
      case '\x01':
switchD_0010a452_caseD_1:
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_16;
        break;
      case '\x02':
switchD_0010a452_caseD_2:
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_16;
        break;
      case '\x03':
switchD_0010a4ba_caseD_3:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_FLOAT16;
        break;
      case '\x04':
switchD_0010a4e7_caseD_4:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_REQUIRED_BITS;
        break;
      case '\x05':
switchD_0010a4e7_caseD_5:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT8;
        break;
      case '\x06':
switchD_0010a4e7_caseD_6:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_MAX_VALUE;
        break;
      case '\a':
switchD_0010a4e7_caseD_7:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT16;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb7a,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      break;
    case 0xd:
    case 0x11:
      ZVar14 = (instruction->raw).mvex.SSS;
      if (ZVar14 != '\0') {
        if (ZVar14 == '\x02') {
          (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_8;
        }
        else {
          if (ZVar14 != '\x01') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xba7,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_8;
        }
      }
      break;
    case 0xe:
    case 0xf:
    case 0x10:
      switch((instruction->raw).mvex.SSS) {
      case '\0':
        break;
      case '\x01':
        goto switchD_0010a452_caseD_1;
      case '\x02':
        goto switchD_0010a452_caseD_2;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb97,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x04':
        goto switchD_0010a4e7_caseD_4;
      case '\x05':
        goto switchD_0010a4e7_caseD_5;
      case '\x06':
        goto switchD_0010a4e7_caseD_6;
      case '\a':
        goto switchD_0010a4e7_caseD_7;
      }
    case 0x12:
    case 0x16:
      switch((instruction->raw).mvex.SSS) {
      case '\0':
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xbc0,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x03':
        goto switchD_0010a4ba_caseD_3;
      case '\x04':
        goto switchD_0010a4e7_caseD_4;
      case '\x05':
        goto switchD_0010a4e7_caseD_5;
      case '\x06':
        goto switchD_0010a4e7_caseD_6;
      case '\a':
        goto switchD_0010a4e7_caseD_7;
      }
    case 0x14:
    case 0x18:
      switch((instruction->raw).mvex.SSS) {
      case '\0':
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xbd9,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x04':
        goto switchD_0010a4e7_caseD_4;
      case '\x05':
        goto switchD_0010a4e7_caseD_5;
      case '\x06':
        goto switchD_0010a4e7_caseD_6;
      case '\a':
        goto switchD_0010a4e7_caseD_7;
      }
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xbe0,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (((instruction->raw).modrm.mod != '\x03') && ((instruction->raw).mvex.E != '\0')) {
      (instruction->avx).has_eviction_hint = '\x01';
    }
    (instruction->avx).mask.mode = ZYDIS_MASK_MODE_MERGING;
    (instruction->avx).mask.reg = (instruction->raw).mvex.kkk + ZYDIS_REGISTER_K0;
  default:
    goto switchD_00109b9b_default;
  }
  bVar15 = bVar28 >> 5;
  bVar49 = *(byte *)((long)&ZydisSetAVXInformation_element_sizes + (ulong)bVar15);
  (local_b8->evex).element_size = bVar49;
  bVar51 = *(byte *)((long)puVar12 + 0xd);
  switch(bVar51 & 0x1f) {
  case 1:
    uVar45 = (ulong)(instruction->raw).evex.b;
    if (1 < uVar45) {
      __assert_fail("evex_b < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x954,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (uVar45 != 0) {
      bVar55 = (bVar28 & 0xc0) != 0x40;
      if ((local_b8->vector_unified).W != '\0') {
        bVar55 = bVar15 != 4;
      }
      if (bVar55) {
        __assert_fail("!evex_b || ((!context->vector_unified.W && (context->evex.element_size == 16 || context->evex.element_size == 32)) || ( context->vector_unified.W && context->evex.element_size == 64))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x957,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if ((*(ushort *)((long)puVar12 + 0xe) & 3) != 1) {
        __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x958,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    if (bVar15 == 5) {
      __assert_fail("size_index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x98e,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar42 = (ulong)(bVar49 >> 5);
    local_b8->cd8_scale = ZydisSetAVXInformation_scales[uVar26 + uVar42 * 3 + uVar45 * 9];
    puVar35 = ZydisSetAVXInformation_broadcasts_104 + uVar45 * 0x24;
    goto LAB_0010a71c;
  case 2:
    uVar45 = (ulong)(instruction->raw).evex.b;
    if (1 < uVar45) {
      __assert_fail("evex_b < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x997,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((local_b8->vector_unified).W != '\0') {
      __assert_fail("!context->vector_unified.W",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x998,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((bVar28 & 0xc0) != 0x40) {
      __assert_fail("(context->evex.element_size == 16) || (context->evex.element_size == 32)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x99a,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((uVar45 != 0) && ((*(ushort *)((long)puVar12 + 0xe) & 3) != 1)) {
      __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x99b,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar15 == 5) {
      __assert_fail("size_index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x9c5,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar42 = (ulong)(bVar49 >> 5);
    local_b8->cd8_scale = ZydisSetAVXInformation_scales_108[uVar26 + uVar42 * 3 + uVar45 * 6];
    puVar35 = ZydisSetAVXInformation_broadcasts_109 + uVar45 * 0x18;
LAB_0010a71c:
    ZVar54 = *(ZydisBroadcastMode *)(puVar35 + uVar26 * 4 + uVar42 * 0xc);
LAB_0010a931:
    (instruction->avx).broadcast.mode = ZVar54;
    goto LAB_0010aa3e;
  case 3:
    puVar43 = &ZydisSetAVXInformation_scales_110;
    break;
  case 4:
    goto switchD_00109c82_caseD_4;
  case 5:
    if (bVar15 == 5) {
      __assert_fail("size_index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x9fa,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    ZVar14 = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_120 + (ulong)(bVar49 >> 5));
    goto LAB_0010a9ed;
  case 6:
    if (bVar15 != 3) {
      __assert_fail("context->evex.element_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa00,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((local_b8->vector_unified).W != '\0') {
      __assert_fail("context->vector_unified.W == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa01,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
  case 0xe:
switchD_00109c82_caseD_e:
    local_b8->cd8_scale = '\x10';
    goto LAB_0010aa3e;
  case 7:
    ZVar14 = (local_b8->vector_unified).W;
    if (ZVar14 == '\x01') {
      if (bVar15 != 4) {
        __assert_fail("context->evex.element_size == 64",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x9db,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    else {
      if (ZVar14 != '\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x9de,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if (bVar15 != 3) {
        __assert_fail("context->evex.element_size == 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x9d8,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    goto switchD_00109c82_caseD_4;
  case 8:
    ZVar14 = (local_b8->vector_unified).W;
    if (ZVar14 != '\x01') {
      if (ZVar14 != '\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xa12,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if (bVar15 != 3) {
        __assert_fail("context->evex.element_size == 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xa08,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      local_b8->cd8_scale = '\b';
      goto LAB_0010aa3e;
    }
    if (bVar15 != 4) {
      __assert_fail("context->evex.element_size == 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa0c,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((ZVar18 != 0x100) && (ZVar18 != 0x200)) {
      __assert_fail("(instruction->avx.vector_length == 256) || (instruction->avx.vector_length == 512)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa0e,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    goto switchD_00109c82_caseD_e;
  case 9:
    ZVar14 = (local_b8->vector_unified).W;
    if (ZVar14 == '\x01') {
      if (bVar15 != 4) {
        __assert_fail("context->evex.element_size == 64",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xa1f,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if (bVar47 != 2) {
        __assert_fail("instruction->avx.vector_length == 512",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xa20,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      goto LAB_0010aa35;
    }
    if (ZVar14 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa24,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar15 != 3) {
      __assert_fail("context->evex.element_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa19,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((ZVar18 != 0x100) && (ZVar18 != 0x200)) {
      __assert_fail("(instruction->avx.vector_length == 256) || (instruction->avx.vector_length == 512)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa1b,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    goto switchD_00109c82_caseD_e;
  case 10:
    if ((local_b8->vector_unified).W != '\0') {
      __assert_fail("!context->vector_unified.W",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa28,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar47 != 2) {
      __assert_fail("instruction->avx.vector_length == 512",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa29,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar15 != 3) {
      __assert_fail("context->evex.element_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa2a,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
LAB_0010aa35:
    local_b8->cd8_scale = ' ';
    goto LAB_0010aa3e;
  case 0xb:
    puVar43 = &ZydisSetAVXInformation_scales_118;
    break;
  case 0xc:
    puVar43 = &ZydisSetAVXInformation_scales_119;
    break;
  case 0xd:
    puVar43 = &ZydisSetAVXInformation_scales_120;
    break;
  case 0xf:
    puVar43 = &ZydisSetAVXInformation_scales_121;
    break;
  case 0x10:
    uVar45 = (ulong)(instruction->raw).evex.b;
    if (1 < uVar45) {
      __assert_fail("evex_b < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa57,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((local_b8->vector_unified).W != '\0') {
      __assert_fail("!context->vector_unified.W",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa58,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar15 != 2) {
      __assert_fail("context->evex.element_size == 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa59,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((uVar45 != 0) && ((*(ushort *)((long)puVar12 + 0xe) & 3) != 1)) {
      __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa5a,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    local_b8->cd8_scale =
         *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_123 + uVar26 + uVar45 * 3);
    ZVar54 = *(ZydisBroadcastMode *)
              (ZydisSetAVXInformation_broadcasts_124 + uVar26 * 4 + uVar45 * 0xc);
    goto LAB_0010a931;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0xa75,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar14 = *(ZyanU8 *)(uVar26 + (long)puVar43);
LAB_0010a9ed:
  local_b8->cd8_scale = ZVar14;
LAB_0010aa3e:
  if ((*(ushort *)((long)puVar12 + 0xe) & 0x780) != 0) {
    if ((instruction->avx).broadcast.mode != ZYDIS_BROADCAST_MODE_INVALID) {
      __assert_fail("!instruction->avx.broadcast.mode",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa7f,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).broadcast.is_static = '\x01';
    uVar23 = *(ushort *)((long)puVar12 + 0xe) >> 7 & 0xf;
    if (0xc < (ushort)uVar23) {
      __assert_fail("def->broadcast < (sizeof(broadcasts) / sizeof((broadcasts)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa91,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).broadcast.mode =
         *(ZydisBroadcastMode *)(ZydisSetAVXInformation_broadcasts_127 + (ulong)uVar23 * 4);
  }
  if (((instruction->raw).evex.b != '\0') &&
     (uVar19 = *(ushort *)((long)puVar12 + 0xe) & 3, 1 < uVar19)) {
    if (uVar19 != 3) {
      (instruction->avx).rounding.mode = bVar44 + ZYDIS_ROUNDING_MODE_RN;
    }
    (instruction->avx).has_sae = '\x01';
  }
  bVar44 = (instruction->raw).evex.aaa;
  (instruction->avx).mask.reg = bVar44 + ZYDIS_REGISTER_K0;
  switch(*(ushort *)((long)puVar12 + 0xe) >> 5 & 3) {
  case 0:
    iVar13 = 2;
    break;
  case 1:
    ZVar31 = ZYDIS_MASK_MODE_REQUIRED_BITS;
    goto LAB_0010aad9;
  case 2:
    iVar13 = 4;
    break;
  case 3:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0xab7,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar31 = (uint)(instruction->raw).evex.z + iVar13;
LAB_0010aad9:
  ZVar33 = ZYDIS_MASK_MODE_DISABLED;
  if (bVar44 != 0) {
    ZVar33 = ZVar31;
  }
  (instruction->avx).mask.mode = ZVar33;
switchD_00109b9b_default:
  ZVar16 = ZydisGetAccessedFlags
                     ((ZydisInstructionDefinition *)
                      CONCAT44(uStack_ac,
                               CONCAT13(prefix_bytes[3],
                                        CONCAT12(prefix_bytes[2],
                                                 CONCAT11(prefix_bytes[1],prefix_bytes[0])))),
                      (ZydisDefinitionAccessedFlags **)&modrm_byte_2);
  if (ZVar16 != '\0') {
    pbVar1 = (byte *)((long)&instruction->attributes + 1);
    *pbVar1 = *pbVar1 | 2;
    instruction->cpu_flags = (ZydisAccessedFlags *)CONCAT71(uStack_57,modrm_byte_2);
    instruction->fpu_flags = (ZydisAccessedFlags *)CONCAT71(uStack_57,modrm_byte_2) + 1;
  }
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisDecodeInstruction(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);

    // Iterate through the decoder tree
    const ZydisDecoderTreeNode* node = ZydisDecoderTreeGetRootNode();
    const ZydisDecoderTreeNode* temp = ZYAN_NULL;
    ZydisDecoderTreeNodeType node_type;
    do
    {
        node_type = node->type;
        ZyanU16 index = 0;
        ZyanStatus status = 0;
        switch (node_type)
        {
        case ZYDIS_NODETYPE_INVALID:
            if (temp)
            {
                node = temp;
                temp = ZYAN_NULL;
                node_type = ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX;
                if (state->prefixes.mandatory_candidate != 0x00)
                {
                    instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
                        ZYDIS_PREFIX_TYPE_IGNORED;
                }
                if (state->prefixes.mandatory_candidate == 0x66)
                {
                    if (state->prefixes.offset_osz_override ==
                        state->prefixes.offset_mandatory)
                    {
                        instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
                            ZYDIS_PREFIX_TYPE_EFFECTIVE;
                    }
                    instruction->attributes |= ZYDIS_ATTRIB_HAS_OPERANDSIZE;
                }
                continue;
            }
            return ZYDIS_STATUS_DECODING_ERROR;
        case ZYDIS_NODETYPE_FILTER_XOP:
            status = ZydisNodeHandlerXOP(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_VEX:
            status = ZydisNodeHandlerVEX(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_EMVEX:
            status = ZydisNodeHandlerEMVEX(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_OPCODE:
            status = ZydisNodeHandlerOpcode(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODE:
            status = ZydisNodeHandlerMode(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_COMPACT:
            status = ZydisNodeHandlerModeCompact(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_MOD:
            status = ZydisNodeHandlerModrmMod(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT:
            status = ZydisNodeHandlerModrmModCompact(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_REG:
            status = ZydisNodeHandlerModrmReg(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_RM:
            status = ZydisNodeHandlerModrmRm(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_PREFIX_GROUP1:
            index = state->prefixes.group1 ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX:
            status = ZydisNodeHandlerMandatoryPrefix(state, instruction, &index);
            temp = ZydisDecoderTreeGetChildNode(node, 0);
            // TODO: Return to this point, if index == 0 contains a value and the previous path
            // TODO: was not successful
            // TODO: Restore consumed prefix
            break;
        case ZYDIS_NODETYPE_FILTER_OPERAND_SIZE:
            status = ZydisNodeHandlerOperandSize(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_ADDRESS_SIZE:
            status = ZydisNodeHandlerAddressSize(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_VECTOR_LENGTH:
            status = ZydisNodeHandlerVectorLength(state->context, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_REX_W:
            status = ZydisNodeHandlerRexW(state->context, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_REX_B:
            status = ZydisNodeHandlerRexB(state->context, instruction, &index);
            break;
#ifndef ZYDIS_DISABLE_AVX512
        case ZYDIS_NODETYPE_FILTER_EVEX_B:
            status = ZydisNodeHandlerEvexB(instruction, &index);
            break;
#endif
#ifndef ZYDIS_DISABLE_KNC
        case ZYDIS_NODETYPE_FILTER_MVEX_E:
            status = ZydisNodeHandlerMvexE(instruction, &index);
            break;
#endif
        case ZYDIS_NODETYPE_FILTER_MODE_AMD:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_AMD_BRANCHES] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_KNC:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_KNC] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_MPX:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_MPX] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_CET:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_CET] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_LZCNT:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_LZCNT] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_TZCNT:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_TZCNT] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_WBNOINVD:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_WBNOINVD] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_CLDEMOTE:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_CLDEMOTE] ? 1 : 0;
            break;
        default:
            if (node_type & ZYDIS_NODETYPE_DEFINITION_MASK)
            {
                const ZydisInstructionDefinition* definition;
                ZydisGetInstructionDefinition(instruction->encoding, node->value, &definition);
                ZydisSetEffectiveOperandWidth(state->context, instruction, definition);
                ZydisSetEffectiveAddressWidth(state->context, instruction, definition);

                const ZydisInstructionEncodingInfo* info;
                ZydisGetInstructionEncodingInfo(node, &info);
                ZYAN_CHECK(ZydisDecodeOptionalInstructionParts(state, instruction, info));
                ZYAN_CHECK(ZydisCheckErrorConditions(state, instruction, definition));

                if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_3DNOW)
                {
                    // Get actual 3DNOW opcode and definition
                    ZYAN_CHECK(ZydisInputNext(state, instruction, &instruction->opcode));
                    node = ZydisDecoderTreeGetRootNode();
                    node = ZydisDecoderTreeGetChildNode(node, 0x0F);
                    node = ZydisDecoderTreeGetChildNode(node, 0x0F);
                    node = ZydisDecoderTreeGetChildNode(node, instruction->opcode);
                    if (node->type == ZYDIS_NODETYPE_INVALID)
                    {
                        return ZYDIS_STATUS_DECODING_ERROR;
                    }
                    ZYAN_ASSERT(node->type == ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT);
                    node = ZydisDecoderTreeGetChildNode(
                        node, (instruction->raw.modrm.mod == 0x3) ? 0 : 1);
                    ZYAN_ASSERT(node->type & ZYDIS_NODETYPE_DEFINITION_MASK);
                    ZydisGetInstructionDefinition(instruction->encoding, node->value, &definition);
                }

                instruction->mnemonic = definition->mnemonic;

#ifndef ZYDIS_MINIMAL_MODE

                instruction->operand_count = definition->operand_count;
                instruction->operand_count_visible = definition->operand_count_visible;
                state->context->definition = definition;

                instruction->meta.category = definition->category;
                instruction->meta.isa_set = definition->isa_set;
                instruction->meta.isa_ext = definition->isa_ext;
                instruction->meta.branch_type = definition->branch_type;
                ZYAN_ASSERT((instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_NONE) ||
                        ((instruction->meta.category == ZYDIS_CATEGORY_CALL) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_COND_BR) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_UNCOND_BR) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_RET)));
                instruction->meta.exception_class = definition->exception_class;

                if (!state->decoder->decoder_mode[ZYDIS_DECODER_MODE_MINIMAL])
                {
                    ZydisSetAttributes(state, instruction, definition);
                    switch (instruction->encoding)
                    {
                    case ZYDIS_INSTRUCTION_ENCODING_XOP:
                    case ZYDIS_INSTRUCTION_ENCODING_VEX:
                    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
                    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
                        ZydisSetAVXInformation(state->context, instruction, definition);
                        break;
                    default:
                        break;
                    }

                    const ZydisDefinitionAccessedFlags* flags;
                    if (ZydisGetAccessedFlags(definition, &flags))
                    {
                        instruction->attributes |= ZYDIS_ATTRIB_CPUFLAG_ACCESS;
                        instruction->cpu_flags = &flags->cpu_flags;
                        instruction->fpu_flags = &flags->fpu_flags;
                    }
                }

#endif

                return ZYAN_STATUS_SUCCESS;
            }
            ZYAN_UNREACHABLE;
        }
        ZYAN_CHECK(status);
        node = ZydisDecoderTreeGetChildNode(node, index);
    } while ((node_type != ZYDIS_NODETYPE_INVALID) && !(node_type & ZYDIS_NODETYPE_DEFINITION_MASK));
    return ZYAN_STATUS_SUCCESS;
}